

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O2

int __thiscall QFbScreen::raise(QFbScreen *this,int __sig)

{
  qsizetype qVar1;
  QWindow *pQVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QFbWindow *window_local;
  long local_18;
  
  window_local = (QFbWindow *)CONCAT44(in_register_00000034,__sig);
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QtPrivate::indexOf<QFbWindow*,QFbWindow*>
                    ((QList<QFbWindow_*> *)(this + 0x20),&window_local,0);
  if (0 < (int)(uint)qVar1) {
    QList<QFbWindow_*>::move
              ((QList<QFbWindow_*> *)(this + 0x20),(ulong)((uint)qVar1 & 0x7fffffff),0);
    (**(code **)(*(long *)window_local + 0x30))();
    (**(code **)(*(long *)this + 0xd0))(this);
    pQVar2 = topWindow(this);
    QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
              (pQVar2,7);
    (**(code **)(*(long *)this + 0xb8))(this,pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::raise(QFbWindow *window)
{
    int index = mWindowStack.indexOf(window);
    if (index <= 0)
        return;
    mWindowStack.move(index, 0);
    setDirty(window->geometry());
    QWindow *w = topWindow();
    QWindowSystemInterface::handleFocusWindowChanged(w);
    topWindowChanged(w);
}